

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_registry.hpp
# Opt level: O2

service * boost::asio::detail::service_registry::
          create<boost::asio::detail::reactive_descriptor_service,boost::asio::io_context>
                    (void *owner)

{
  reactive_descriptor_service *this;
  
  this = (reactive_descriptor_service *)operator_new(0x30);
  reactive_descriptor_service::reactive_descriptor_service(this,(io_context *)owner);
  return (service *)this;
}

Assistant:

execution_context::service* service_registry::create(void* owner)
{
  return new Service(*static_cast<Owner*>(owner));
}